

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

int AF_AActor_IsVisible(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  VMValue *pVVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar5;
  AActor *other;
  AActor *lookee;
  bool bVar6;
  PClass *pPVar4;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003f3bfd;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003f3be4:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003f3bfd:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x54a,
                  "int AF_AActor_IsVisible(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  lookee = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (lookee == (AActor *)0x0) goto LAB_003f3aa1;
    pPVar4 = (lookee->super_DThinker).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar3 = (**(lookee->super_DThinker).super_DObject._vptr_DObject)(lookee);
      pPVar4 = (PClass *)CONCAT44(extraout_var,iVar3);
      (lookee->super_DThinker).super_DObject.Class = pPVar4;
    }
    bVar6 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar2 && bVar6) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar6 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar2) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar6) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003f3bfd;
    }
  }
  else {
    if (lookee != (AActor *)0x0) goto LAB_003f3be4;
LAB_003f3aa1:
    lookee = (AActor *)0x0;
  }
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003f3c1c;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003f3bed:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003f3c1c:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x54b,
                  "int AF_AActor_IsVisible(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  other = (AActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (other == (AActor *)0x0) goto LAB_003f3b42;
    pPVar4 = (other->super_DThinker).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar3 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
      pPVar4 = (PClass *)CONCAT44(extraout_var_00,iVar3);
      (other->super_DThinker).super_DObject.Class = pPVar4;
    }
    bVar6 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar2 && bVar6) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar6 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar2) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar6) {
      pcVar5 = "other == NULL || other->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003f3c1c;
    }
  }
  else {
    if (other != (AActor *)0x0) goto LAB_003f3bed;
LAB_003f3b42:
    other = (AActor *)0x0;
  }
  if (numparam < 3) {
    pcVar5 = "(paramnum) < numparam";
  }
  else {
    if (param[2].field_0.field_3.Type == '\0') {
      pVVar1 = param + 2;
      if (numparam == 3) {
        param = defaultparam->Array;
        if ((param[3].field_0.field_3.Type == '\x03') && (param[3].field_0.field_1.atag == 0)) {
LAB_003f3b97:
          bVar6 = P_IsVisible(lookee,other,(uint)((pVVar1->field_0).i != 0),
                              (FLookExParams *)param[3].field_0.field_1.a);
          if (numret < 1) {
            iVar3 = 0;
          }
          else {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                            ,0x54e,
                            "int AF_AActor_IsVisible(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            if (ret->RegType != '\0') {
              __assert_fail("RegType == REGT_INT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                            ,0x13f,"void VMReturn::SetInt(int)");
            }
            *(uint *)ret->Location = (uint)bVar6;
            iVar3 = 1;
          }
          return iVar3;
        }
        pcVar5 = 
        "(defaultparam[paramnum]).Type == REGT_POINTER && (defaultparam[paramnum]).atag == ATAG_GENERIC"
        ;
      }
      else {
        if ((param[3].field_0.field_3.Type == '\x03') && (param[3].field_0.field_1.atag == 0))
        goto LAB_003f3b97;
        pcVar5 = "(param[paramnum]).Type == REGT_POINTER && (param[paramnum]).atag == ATAG_GENERIC";
      }
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x54d,
                    "int AF_AActor_IsVisible(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar5 = "param[paramnum].Type == REGT_INT";
  }
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0x54c,"int AF_AActor_IsVisible(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, IsVisible)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT(other, AActor);
	PARAM_BOOL(allaround);
	PARAM_POINTER_DEF(params, FLookExParams);
	ACTION_RETURN_BOOL(P_IsVisible(self, other, allaround, params));
}